

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

pair<cmQtAutoGen::IntegerVersion,_unsigned_int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget *target,string *mocExecutable)

{
  cmMakefile *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *str;
  cmValue cVar6;
  cmValue cVar7;
  pointer pIVar8;
  reference pvVar9;
  cmTarget *this;
  istream *piVar10;
  uint __val;
  undefined1 *puVar11;
  ulong uVar12;
  long lVar13;
  value_type vVar14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> pVar15;
  anon_class_1_0_00000001 toUInt2;
  string major;
  string capturedStdOut;
  unsigned_long tmp;
  anon_class_1_0_00000001 *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  int exitCode;
  allocator<char> local_1f8 [32];
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> knownQtVersions;
  string mocTargetName;
  string local_190 [352];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mocTargetName,"QT_MAJOR_VERSION",(allocator<char> *)&capturedStdOut);
  std::__cxx11::string::string<std::allocator<char>>((string *)&major,"",local_1f8);
  str = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty(target,&mocTargetName,&major);
  tmp = 0;
  __val = 0;
  if ((str != (char *)0x0) && (bVar2 = cmStrToULong(str,&tmp), __val = 0, bVar2)) {
    __val = (uint)tmp;
  }
  std::__cxx11::string::~string((string *)&major);
  std::__cxx11::string::~string((string *)&mocTargetName);
  knownQtVersions.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  knownQtVersions.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  knownQtVersions.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::reserve
            (&knownQtVersions,6);
  local_218 = &toUInt2;
  puVar11 = GetQtVersion(cmGeneratorTarget_const*,std::__cxx11::string)::keys;
  tmp = (unsigned_long)&knownQtVersions;
  for (lVar13 = 0x60; lVar13 != 0; lVar13 = lVar13 + -0x20) {
    pcVar1 = target->Makefile;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&mocTargetName,(basic_string_view<char,_std::char_traits<char>_> *)puVar11,
               (allocator<char> *)&capturedStdOut);
    cVar6 = cmMakefile::GetDefinition(pcVar1,&mocTargetName);
    pcVar1 = target->Makefile;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&major,
               (basic_string_view<char,_std::char_traits<char>_> *)((long)puVar11 + 0x10),local_1f8)
    ;
    cVar7 = cmMakefile::GetDefinition(pcVar1,&major);
    GetQtVersion::anon_class_16_2_f7459e05::operator()((anon_class_16_2_f7459e05 *)&tmp,cVar6,cVar7)
    ;
    std::__cxx11::string::~string((string *)&major);
    std::__cxx11::string::~string((string *)&mocTargetName);
    puVar11 = (undefined1 *)((long)puVar11 + 0x20);
  }
  puVar11 = GetQtVersion(cmGeneratorTarget_const*,std::__cxx11::string)::keys;
  for (lVar13 = 0x60; lVar13 != 0; lVar13 = lVar13 + -0x20) {
    pcVar1 = target->Makefile;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&mocTargetName,(basic_string_view<char,_std::char_traits<char>_> *)puVar11,
               (allocator<char> *)&capturedStdOut);
    cVar6 = cmMakefile::GetProperty(pcVar1,&mocTargetName);
    pcVar1 = target->Makefile;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&major,
               (basic_string_view<char,_std::char_traits<char>_> *)((long)puVar11 + 0x10),local_1f8)
    ;
    cVar7 = cmMakefile::GetProperty(pcVar1,&major);
    GetQtVersion::anon_class_16_2_f7459e05::operator()((anon_class_16_2_f7459e05 *)&tmp,cVar6,cVar7)
    ;
    std::__cxx11::string::~string((string *)&major);
    std::__cxx11::string::~string((string *)&mocTargetName);
    puVar11 = (undefined1 *)((long)puVar11 + 0x20);
  }
  uVar12 = 0;
  if (knownQtVersions.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      knownQtVersions.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pIVar8 = knownQtVersions.
             super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (__val == 0) {
      pvVar9 = std::
               vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::at
                         (&knownQtVersions,0);
      vVar14 = *pvVar9;
      uVar12 = (ulong)vVar14 >> 0x20;
LAB_00384984:
      if (vVar14.Major != 0) goto LAB_00384cac;
    }
    else {
      for (; pIVar8 != knownQtVersions.
                       super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pIVar8 = pIVar8 + 1) {
        if (pIVar8->Major == __val) {
          uVar12 = (ulong)pIVar8->Minor;
          vVar14.Minor = 0;
          vVar14.Major = __val;
          goto LAB_00384984;
        }
      }
    }
  }
  if (mocExecutable->_M_string_length == 0) {
    pcVar1 = target->Makefile;
    capturedStdOut._M_string_length = 0;
    capturedStdOut.field_2._M_local_buf[0] = '\0';
    capturedStdOut._M_dataplus._M_p = (pointer)&capturedStdOut.field_2;
    std::__cxx11::to_string((string *)&tmp,__val);
    std::operator+(&major,"Qt",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp);
    std::operator+(&mocTargetName,&major,"::moc");
    std::__cxx11::string::~string((string *)&major);
    std::__cxx11::string::~string((string *)&tmp);
    this = cmMakefile::FindTargetToUse(pcVar1,&mocTargetName,false);
    if (this != (cmTarget *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&major,"IMPORTED_LOCATION",(allocator<char> *)&tmp);
      cmTarget::GetSafeProperty(this,&major);
      std::__cxx11::string::_M_assign((string *)&capturedStdOut);
      std::__cxx11::string::~string((string *)&major);
    }
    std::__cxx11::string::~string((string *)&mocTargetName);
    std::__cxx11::string::operator=((string *)mocExecutable,(string *)&capturedStdOut);
    std::__cxx11::string::~string((string *)&capturedStdOut);
    if (mocExecutable->_M_string_length == 0) {
      vVar14.Major = 0;
      vVar14.Minor = 0;
      goto LAB_00384cac;
    }
  }
  capturedStdOut._M_string_length = 0;
  capturedStdOut.field_2._M_local_buf[0] = '\0';
  capturedStdOut._M_dataplus._M_p = (pointer)&capturedStdOut.field_2;
  std::__cxx11::string::string((string *)&mocTargetName,(string *)mocExecutable);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"--version",(allocator<char> *)&tmp);
  __l._M_len = 2;
  __l._M_array = &mocTargetName;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&major,__l,(allocator_type *)local_1f8);
  bVar2 = cmSystemTools::RunSingleCommand
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&major,&capturedStdOut,(string *)0x0,&exitCode,(char *)0x0,OUTPUT_NONE,
                     (cmDuration)0x0,Auto);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&major);
  lVar13 = 0x20;
  do {
    std::__cxx11::string::~string(local_190 + lVar13 + -0x20);
    lVar13 = lVar13 + -0x20;
  } while (lVar13 != -0x20);
  uVar12 = 0;
  vVar14.Major = 0;
  vVar14.Minor = 0;
  if (bVar2 && exitCode == 0) {
    std::__cxx11::string::string((string *)local_1f8,(string *)&capturedStdOut);
    if ((parseMocVersion(std::__cxx11::string)::prelude_abi_cxx11_ == '\0') &&
       (iVar5 = __cxa_guard_acquire(&parseMocVersion(std::__cxx11::string)::prelude_abi_cxx11_),
       iVar5 != 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)parseMocVersion(std::__cxx11::string)::prelude_abi_cxx11_,"moc ",
                 (allocator<char> *)&mocTargetName);
      __cxa_atexit(std::__cxx11::string::~string,
                   parseMocVersion(std::__cxx11::string)::prelude_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseMocVersion(std::__cxx11::string)::prelude_abi_cxx11_);
    }
    vVar14.Major = 0;
    vVar14.Minor = 0;
    lVar13 = std::__cxx11::string::find((string *)local_1f8,0x792618);
    if (lVar13 != -1) {
      std::__cxx11::string::erase((ulong)local_1f8,0);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&mocTargetName,(string *)local_1f8,_S_in);
      major._M_dataplus._M_p = (pointer)&major.field_2;
      major._M_string_length = 0;
      uVar12 = 0;
      major.field_2._M_local_buf[0] = '\0';
      tmp = (unsigned_long)&local_210;
      local_218 = (anon_class_1_0_00000001 *)0x0;
      local_210._M_local_buf[0] = '\0';
      piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&mocTargetName,(string *)&major,'.');
      if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0) {
        piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&mocTargetName,(string *)&tmp,'.');
        uVar3 = 0;
        if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0) {
          uVar3 = std::__cxx11::stoi(&major,(size_t *)0x0,10);
          uVar4 = std::__cxx11::stoi((string *)&tmp,(size_t *)0x0,10);
          uVar12 = (ulong)uVar4;
        }
      }
      else {
        uVar3 = 0;
      }
      std::__cxx11::string::~string((string *)&tmp);
      std::__cxx11::string::~string((string *)&major);
      std::__cxx11::istringstream::~istringstream((istringstream *)&mocTargetName);
      vVar14 = (value_type)((ulong)uVar3 | uVar12 << 0x20);
    }
    std::__cxx11::string::~string((string *)local_1f8);
    uVar12 = (ulong)vVar14 >> 0x20;
  }
  std::__cxx11::string::~string((string *)&capturedStdOut);
LAB_00384cac:
  std::_Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::
  ~_Vector_base(&knownQtVersions.
                 super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
               );
  pVar15.first = (IntegerVersion)((ulong)vVar14 & 0xffffffff | uVar12 << 0x20);
  pVar15.second = __val;
  return pVar15;
}

Assistant:

std::pair<cmQtAutoGen::IntegerVersion, unsigned int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget const* target,
                                     std::string mocExecutable)
{
  // Converts a char ptr to an unsigned int value
  auto toUInt = [](const char* const input) -> unsigned int {
    unsigned long tmp = 0;
    if (input && cmStrToULong(input, &tmp)) {
      return static_cast<unsigned int>(tmp);
    }
    return 0u;
  };
  auto toUInt2 = [](cmValue input) -> unsigned int {
    unsigned long tmp = 0;
    if (input && cmStrToULong(*input, &tmp)) {
      return static_cast<unsigned int>(tmp);
    }
    return 0u;
  };

  // Initialize return value to a default
  std::pair<IntegerVersion, unsigned int> res(
    IntegerVersion(),
    toUInt(target->GetLinkInterfaceDependentStringProperty("QT_MAJOR_VERSION",
                                                           "")));

  // Acquire known Qt versions
  std::vector<cmQtAutoGen::IntegerVersion> knownQtVersions;
  {
    // Qt version variable prefixes
    static std::initializer_list<
      std::pair<cm::string_view, cm::string_view>> const keys{
      { "Qt6Core_VERSION_MAJOR", "Qt6Core_VERSION_MINOR" },
      { "Qt5Core_VERSION_MAJOR", "Qt5Core_VERSION_MINOR" },
      { "QT_VERSION_MAJOR", "QT_VERSION_MINOR" },
    };

    knownQtVersions.reserve(keys.size() * 2);

    // Adds a version to the result (nullptr safe)
    auto addVersion = [&knownQtVersions, &toUInt2](cmValue major,
                                                   cmValue minor) {
      cmQtAutoGen::IntegerVersion ver(toUInt2(major), toUInt2(minor));
      if (ver.Major != 0) {
        knownQtVersions.emplace_back(ver);
      }
    };

    // Read versions from variables
    for (auto const& keyPair : keys) {
      addVersion(target->Makefile->GetDefinition(std::string(keyPair.first)),
                 target->Makefile->GetDefinition(std::string(keyPair.second)));
    }

    // Read versions from directory properties
    for (auto const& keyPair : keys) {
      addVersion(target->Makefile->GetProperty(std::string(keyPair.first)),
                 target->Makefile->GetProperty(std::string(keyPair.second)));
    }
  }

  // Evaluate known Qt versions
  if (!knownQtVersions.empty()) {
    if (res.second == 0) {
      // No specific version was requested by the target:
      // Use highest known Qt version.
      res.first = knownQtVersions.at(0);
    } else {
      // Pick a version from the known versions:
      for (auto it : knownQtVersions) {
        if (it.Major == res.second) {
          res.first = it;
          break;
        }
      }
    }
  }

  if (res.first.Major == 0) {
    // We could not get the version number from variables or directory
    // properties. This might happen if the find_package call for Qt is wrapped
    // in a function. Try to find the moc executable path from the available
    // targets and call "moc --version" to get the Qt version.
    if (mocExecutable.empty()) {
      mocExecutable =
        FindMocExecutableFromMocTarget(target->Makefile, res.second);
    }
    if (!mocExecutable.empty()) {
      res.first = GetMocVersion(mocExecutable);
    }
  }

  return res;
}